

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O2

void __thiscall
duckdb::BlockwiseNLJoinLocalScanState::~BlockwiseNLJoinLocalScanState
          (BlockwiseNLJoinLocalScanState *this)

{
  ~BlockwiseNLJoinLocalScanState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit BlockwiseNLJoinLocalScanState(const PhysicalBlockwiseNLJoin &op, BlockwiseNLJoinGlobalScanState &gstate) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<BlockwiseNLJoinGlobalState>();
		sink.right_outer.InitializeScan(gstate.scan_state, scan_state);
	}